

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::serializeDynamicVariablesComputedFromFixedBaseRNEA
          (BerdyHelper *this,JointDOFsDoubleArray *jointAccs,LinkNetExternalWrenches *netExtWrenches
          ,VectorDynSize *d)

{
  byte bVar1;
  Model *pMVar2;
  long lVar3;
  Twist *pTVar4;
  LinkNetTotalWrenchesWithoutGravity *netTotalWrenchesWithoutGrav;
  LinkWrenches *in_RDX;
  BerdyHelper *in_RDI;
  Twist *v;
  SpatialAcc *properAcc;
  SpatialInertia *I;
  LinkConstPtr visitedLink;
  LinkIndex visitedLinkIndex;
  LinkNetTotalWrenchesWithoutGravity linkNetWrenchesWithoutGravity;
  Vector3 zeroVec;
  Vector3 baseProperAcc;
  LinkAccArray linkProperAccs;
  LinkVelArray linkVels;
  FreeFloatingGeneralizedTorques genTrqs;
  LinkInternalWrenches intWrenches;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffd18;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffd20;
  DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  LinkProperAccArray *in_stack_fffffffffffffd58;
  BerdyHelper *in_stack_fffffffffffffd60;
  JointDOFsDoubleArray *in_stack_fffffffffffffd70;
  Twist *in_stack_fffffffffffffd78;
  SpatialInertia local_260 [56];
  Twist local_228 [48];
  JointPosDoubleArray *in_stack_fffffffffffffe08;
  Vector3 *in_stack_fffffffffffffe10;
  Vector3 *in_stack_fffffffffffffe18;
  Vector3 *in_stack_fffffffffffffe20;
  Traversal *in_stack_fffffffffffffe28;
  Model *in_stack_fffffffffffffe30;
  JointDOFsDoubleArray *in_stack_fffffffffffffe40;
  JointDOFsDoubleArray *in_stack_fffffffffffffe48;
  LinkVelArray *in_stack_fffffffffffffe50;
  LinkAccArray *in_stack_fffffffffffffe58;
  long local_160;
  LinkWrenches local_158 [24];
  VectorFixSize<3U> local_140 [3];
  VectorFixSize<3U> local_f0;
  LinkAccArray local_d8 [24];
  LinkVelArray local_c0 [40];
  FreeFloatingGeneralizedTorques local_98 [96];
  LinkWrenches local_38 [32];
  LinkWrenches *local_18;
  
  local_18 = in_RDX;
  iDynTree::LinkWrenches::LinkWrenches(local_38,&in_RDI->m_model);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            (local_98,&in_RDI->m_model);
  iDynTree::LinkVelArray::LinkVelArray(local_c0,&in_RDI->m_model);
  iDynTree::LinkAccArray::LinkAccArray(local_d8,&in_RDI->m_model);
  VectorFixSize<3U>::VectorFixSize(&local_f0);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffd38);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator-(in_stack_fffffffffffffd38);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffffd38);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  VectorFixSize<3U>::VectorFixSize(local_140);
  VectorFixSize<3U>::zero(local_140);
  dynamicsEstimationForwardVelAccKinematics
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe58);
  iDynTree::RNEADynamicPhase
            (&in_RDI->m_model,&in_RDI->m_dynamicsTraversal,&in_RDI->m_jointPos,local_c0,local_d8,
             local_18,local_38,local_98);
  pMVar2 = model(in_RDI);
  iDynTree::LinkWrenches::LinkWrenches(local_158,pMVar2);
  local_160 = 0;
  while( true ) {
    model(in_RDI);
    lVar3 = iDynTree::Model::getNrOfLinks();
    if (lVar3 <= local_160) break;
    pMVar2 = model(in_RDI);
    iDynTree::Model::getLink((long)pMVar2);
    pTVar4 = (Twist *)iDynTree::Link::getInertia();
    in_stack_fffffffffffffd78 = pTVar4;
    in_stack_fffffffffffffd70 =
         (JointDOFsDoubleArray *)iDynTree::LinkAccArray::operator()(local_d8,local_160);
    in_stack_fffffffffffffd60 =
         (BerdyHelper *)iDynTree::LinkVelArray::operator()(local_c0,local_160);
    iDynTree::SpatialInertia::operator*
              ((SpatialInertia *)&stack0xfffffffffffffe10,(SpatialAcc *)pTVar4);
    iDynTree::SpatialInertia::operator*(local_260,pTVar4);
    iDynTree::Twist::operator*(local_228,(SpatialMomentum *)in_stack_fffffffffffffd60);
    iDynTree::Wrench::operator+
              ((Wrench *)&stack0xfffffffffffffe48,(Wrench *)&stack0xfffffffffffffe10);
    in_stack_fffffffffffffd58 =
         (LinkProperAccArray *)iDynTree::LinkWrenches::operator()(local_158,local_160);
    iDynTree::Wrench::operator=
              ((Wrench *)in_stack_fffffffffffffd58,(Wrench *)&stack0xfffffffffffffe48);
    Wrench::~Wrench((Wrench *)0x5271ae);
    Wrench::~Wrench((Wrench *)0x5271bb);
    SpatialMomentum::~SpatialMomentum((SpatialMomentum *)0x5271c8);
    Wrench::~Wrench((Wrench *)0x5271d5);
    local_160 = local_160 + 1;
  }
  netTotalWrenchesWithoutGrav =
       (LinkNetTotalWrenchesWithoutGravity *)
       iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
  bVar1 = serializeDynamicVariables
                    (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,netTotalWrenchesWithoutGrav
                     ,local_18,
                     (LinkInternalWrenches *)
                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
                     (JointDOFsDoubleArray *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd70,
                     (VectorDynSize *)in_stack_fffffffffffffd78);
  iDynTree::LinkWrenches::~LinkWrenches(local_158);
  iDynTree::LinkAccArray::~LinkAccArray(local_d8);
  iDynTree::LinkVelArray::~LinkVelArray(local_c0);
  iDynTree::FreeFloatingGeneralizedTorques::~FreeFloatingGeneralizedTorques(local_98);
  iDynTree::LinkWrenches::~LinkWrenches(local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool BerdyHelper::serializeDynamicVariablesComputedFromFixedBaseRNEA(JointDOFsDoubleArray& jointAccs,
                                                                     LinkNetExternalWrenches& netExtWrenches,
                                                                     VectorDynSize& d)
{
    assert(jointAccs.size() == this->m_model.getNrOfDOFs());
    assert(netExtWrenches.isConsistent(this->m_model));

    LinkInternalWrenches intWrenches(this->m_model);
    FreeFloatingGeneralizedTorques genTrqs(this->m_model);

    LinkVelArray linkVels(this->m_model);
    LinkAccArray linkProperAccs(this->m_model);


    Vector3 baseProperAcc;
    toEigen(baseProperAcc) = -toEigen(m_gravity);
    Vector3 zeroVec;
    zeroVec.zero();
    dynamicsEstimationForwardVelAccKinematics(m_model,m_dynamicsTraversal,
                                                        baseProperAcc,
                                                        zeroVec,
                                                        zeroVec,
                                                        m_jointPos,
                                                        m_jointVel,
                                                        jointAccs,
                                                        linkVels,
                                                        linkProperAccs);

    RNEADynamicPhase(m_model,m_dynamicsTraversal,
                     m_jointPos,linkVels,linkProperAccs,
                     netExtWrenches,intWrenches,genTrqs);

    // Generate the d vector of dynamical variables
    assert(d.size() == this->getNrOfDynamicVariables());

    // LinkNewInternalWrenches (necessary for the old-style berdy)
    LinkNetTotalWrenchesWithoutGravity linkNetWrenchesWithoutGravity(this->model());

    for(LinkIndex visitedLinkIndex = 0; visitedLinkIndex < static_cast<LinkIndex>(model().getNrOfLinks()); visitedLinkIndex++)
     {
         LinkConstPtr visitedLink = this->model().getLink(visitedLinkIndex);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAccs(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVels(visitedLinkIndex);
         linkNetWrenchesWithoutGravity(visitedLinkIndex) = I*properAcc + v*(I*v);
     }

     return serializeDynamicVariables(linkProperAccs,linkNetWrenchesWithoutGravity,netExtWrenches,
                                      intWrenches,genTrqs.jointTorques(),jointAccs,d);
}